

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool __thiscall
Fossilize::StateRecorder::Impl::get_hash_for_shader_module
          (Impl *this,VkPipelineShaderStageModuleIdentifierCreateInfoEXT *info,Hash *hash)

{
  bool bVar1;
  uint *puVar2;
  pointer pvVar3;
  unsigned_long uVar4;
  _Node_iterator_base<std::pair<const_VkShaderModuleIdentifierEXT,_VkShaderModule_T_*>,_true>
  local_78;
  _Node_iterator_base<std::pair<const_VkShaderModuleIdentifierEXT,_VkShaderModule_T_*>,_true>
  local_70;
  const_iterator itr;
  undefined1 local_60 [8];
  VkShaderModuleIdentifierEXT ident;
  Hash *hash_local;
  VkPipelineShaderStageModuleIdentifierCreateInfoEXT *info_local;
  Impl *this_local;
  
  ident._48_8_ = hash;
  memset(local_60,0,0x38);
  local_60._0_4_ = VK_STRUCTURE_TYPE_SHADER_MODULE_IDENTIFIER_EXT;
  itr.
  super__Node_iterator_base<std::pair<const_VkShaderModuleIdentifierEXT,_VkShaderModule_T_*>,_true>.
  _M_cur._4_4_ = 0x20;
  puVar2 = std::min<unsigned_int>
                     (&info->identifierSize,
                      (uint *)((long)&itr.
                                      super__Node_iterator_base<std::pair<const_VkShaderModuleIdentifierEXT,_VkShaderModule_T_*>,_true>
                                      ._M_cur + 4));
  ident.pNext._0_4_ = *puVar2;
  memcpy((void *)((long)&ident.pNext + 4),info->pIdentifier,(ulong)(uint)ident.pNext);
  local_70._M_cur =
       (__node_type *)
       std::
       unordered_map<VkShaderModuleIdentifierEXT,_VkShaderModule_T_*,_std::hash<VkShaderModuleIdentifierEXT>,_std::equal_to<VkShaderModuleIdentifierEXT>,_std::allocator<std::pair<const_VkShaderModuleIdentifierEXT,_VkShaderModule_T_*>_>_>
       ::find(&this->identifier_to_module,(key_type *)local_60);
  local_78._M_cur =
       (__node_type *)
       std::
       unordered_map<VkShaderModuleIdentifierEXT,_VkShaderModule_T_*,_std::hash<VkShaderModuleIdentifierEXT>,_std::equal_to<VkShaderModuleIdentifierEXT>,_std::allocator<std::pair<const_VkShaderModuleIdentifierEXT,_VkShaderModule_T_*>_>_>
       ::end(&this->identifier_to_module);
  bVar1 = std::__detail::operator==(&local_70,&local_78);
  if (!bVar1) {
    pvVar3 = std::__detail::
             _Node_const_iterator<std::pair<const_VkShaderModuleIdentifierEXT,_VkShaderModule_T_*>,_false,_true>
             ::operator->((_Node_const_iterator<std::pair<const_VkShaderModuleIdentifierEXT,_VkShaderModule_T_*>,_false,_true>
                           *)&local_70);
    uVar4 = api_object_cast<unsigned_long,VkShaderModule_T*>(pvVar3->second);
    *(unsigned_long *)ident._48_8_ = uVar4;
  }
  this_local._7_1_ = !bVar1;
  return this_local._7_1_;
}

Assistant:

bool StateRecorder::Impl::get_hash_for_shader_module(
		const VkPipelineShaderStageModuleIdentifierCreateInfoEXT *info, Hash *hash) const
{
	VkShaderModuleIdentifierEXT ident = { VK_STRUCTURE_TYPE_SHADER_MODULE_IDENTIFIER_EXT };
	ident.identifierSize = std::min<uint32_t>(info->identifierSize, VK_MAX_SHADER_MODULE_IDENTIFIER_SIZE_EXT);
	memcpy(ident.identifier, info->pIdentifier, ident.identifierSize);
	auto itr = identifier_to_module.find(ident);

	if (itr == identifier_to_module.end())
	{
		return false;
	}
	else
	{
		*hash = api_object_cast<Hash>(itr->second);
		return true;
	}
}